

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qitemselectionmodel.cpp
# Opt level: O2

void QItemSelection::split
               (QItemSelectionRange *range,QItemSelectionRange *other,QItemSelection *result)

{
  bool bVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  uint uVar7;
  int iVar8;
  QAbstractItemModel *pQVar9;
  QAbstractItemModel *pQVar10;
  ulong uVar11;
  long in_FS_OFFSET;
  uint local_c8;
  QItemSelectionRange local_a8;
  QModelIndex local_98;
  QModelIndex local_78;
  undefined1 *local_58;
  undefined1 *puStack_50;
  totally_ordered_wrapper<const_QAbstractItemModel_*> local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  QPersistentModelIndex::parent((QModelIndex *)&local_58,&range->tl);
  QPersistentModelIndex::parent(&local_78,&other->tl);
  bVar1 = ::operator!=((QModelIndex *)&local_58,&local_78);
  if (!bVar1) {
    pQVar9 = QPersistentModelIndex::model(&range->tl);
    pQVar10 = QPersistentModelIndex::model(&other->tl);
    if (pQVar9 == pQVar10) {
      local_48.ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
      local_58 = &DAT_aaaaaaaaaaaaaaaa;
      puStack_50 = &DAT_aaaaaaaaaaaaaaaa;
      QPersistentModelIndex::parent((QModelIndex *)&local_58,&other->tl);
      uVar2 = QPersistentModelIndex::row(&range->tl);
      uVar3 = QPersistentModelIndex::column(&range->tl);
      local_c8 = QPersistentModelIndex::row(&range->br);
      uVar4 = QPersistentModelIndex::column(&range->br);
      uVar5 = QPersistentModelIndex::row(&other->tl);
      iVar6 = QPersistentModelIndex::column(&other->tl);
      uVar7 = QPersistentModelIndex::row(&other->br);
      iVar8 = QPersistentModelIndex::column(&other->br);
      pQVar9 = QPersistentModelIndex::model(&range->tl);
      uVar11 = (ulong)uVar2;
      if ((int)uVar2 < (int)uVar5) {
        local_78.m.ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
        local_78.r = -0x55555556;
        local_78.c = -0x55555556;
        local_78.i._0_4_ = 0xaaaaaaaa;
        local_78.i._4_4_ = 0xaaaaaaaa;
        (*(pQVar9->super_QObject)._vptr_QObject[0xc])(&local_78,pQVar9,uVar11,(ulong)uVar3);
        local_98.m.ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
        local_98.r = -0x55555556;
        local_98.c = -0x55555556;
        local_98.i._0_4_ = 0xaaaaaaaa;
        local_98.i._4_4_ = 0xaaaaaaaa;
        (*(pQVar9->super_QObject)._vptr_QObject[0xc])
                  (&local_98,pQVar9,(ulong)(uVar5 - 1),(ulong)uVar4,&local_58);
        QItemSelectionRange::QItemSelectionRange(&local_a8,&local_78,&local_98);
        QList<QItemSelectionRange>::emplaceBack<QItemSelectionRange>
                  (&result->super_QList<QItemSelectionRange>,&local_a8);
        QItemSelectionRange::~QItemSelectionRange(&local_a8);
        uVar11 = (ulong)uVar5;
      }
      if ((int)uVar7 < (int)local_c8) {
        local_78.m.ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
        local_78.r = -0x55555556;
        local_78.c = -0x55555556;
        local_78.i._0_4_ = 0xaaaaaaaa;
        local_78.i._4_4_ = 0xaaaaaaaa;
        (*(pQVar9->super_QObject)._vptr_QObject[0xc])
                  (&local_78,pQVar9,(ulong)(uVar7 + 1),(ulong)uVar3,&local_58);
        local_98.m.ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
        local_98.r = -0x55555556;
        local_98.c = -0x55555556;
        local_98.i._0_4_ = 0xaaaaaaaa;
        local_98.i._4_4_ = 0xaaaaaaaa;
        (*(pQVar9->super_QObject)._vptr_QObject[0xc])
                  (&local_98,pQVar9,(ulong)local_c8,(ulong)uVar4,&local_58);
        QItemSelectionRange::QItemSelectionRange(&local_a8,&local_78,&local_98);
        QList<QItemSelectionRange>::emplaceBack<QItemSelectionRange>
                  (&result->super_QList<QItemSelectionRange>,&local_a8);
        QItemSelectionRange::~QItemSelectionRange(&local_a8);
        local_c8 = uVar7;
      }
      if ((int)uVar3 < iVar6) {
        local_78.m.ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
        local_78.r = -0x55555556;
        local_78.c = -0x55555556;
        local_78.i._0_4_ = 0xaaaaaaaa;
        local_78.i._4_4_ = 0xaaaaaaaa;
        (*(pQVar9->super_QObject)._vptr_QObject[0xc])
                  (&local_78,pQVar9,uVar11,(ulong)uVar3,&local_58);
        local_98.m.ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
        local_98.r = -0x55555556;
        local_98.c = -0x55555556;
        local_98.i._0_4_ = 0xaaaaaaaa;
        local_98.i._4_4_ = 0xaaaaaaaa;
        (*(pQVar9->super_QObject)._vptr_QObject[0xc])
                  (&local_98,pQVar9,(ulong)local_c8,(ulong)(iVar6 - 1),&local_58);
        QItemSelectionRange::QItemSelectionRange(&local_a8,&local_78,&local_98);
        QList<QItemSelectionRange>::emplaceBack<QItemSelectionRange>
                  (&result->super_QList<QItemSelectionRange>,&local_a8);
        QItemSelectionRange::~QItemSelectionRange(&local_a8);
      }
      if (iVar8 < (int)uVar4) {
        local_78.m.ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
        local_78.r = -0x55555556;
        local_78.c = -0x55555556;
        local_78.i._0_4_ = 0xaaaaaaaa;
        local_78.i._4_4_ = 0xaaaaaaaa;
        (*(pQVar9->super_QObject)._vptr_QObject[0xc])
                  (&local_78,pQVar9,uVar11,(ulong)(iVar8 + 1),&local_58);
        local_98.m.ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
        local_98.r = -0x55555556;
        local_98.c = -0x55555556;
        local_98.i._0_4_ = 0xaaaaaaaa;
        local_98.i._4_4_ = 0xaaaaaaaa;
        (*(pQVar9->super_QObject)._vptr_QObject[0xc])
                  (&local_98,pQVar9,(ulong)local_c8,(ulong)uVar4,&local_58);
        QItemSelectionRange::QItemSelectionRange(&local_a8,&local_78,&local_98);
        QList<QItemSelectionRange>::emplaceBack<QItemSelectionRange>
                  (&result->super_QList<QItemSelectionRange>,&local_a8);
        QItemSelectionRange::~QItemSelectionRange(&local_a8);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QItemSelection::split(const QItemSelectionRange &range,
                           const QItemSelectionRange &other, QItemSelection *result)
{
    if (range.parent() != other.parent() || range.model() != other.model())
        return;

    QModelIndex parent = other.parent();
    int top = range.top();
    int left = range.left();
    int bottom = range.bottom();
    int right = range.right();
    int other_top = other.top();
    int other_left = other.left();
    int other_bottom = other.bottom();
    int other_right = other.right();
    const QAbstractItemModel *model = range.model();
    Q_ASSERT(model);
    if (other_top > top) {
        QModelIndex tl = model->index(top, left, parent);
        QModelIndex br = model->index(other_top - 1, right, parent);
        result->append(QItemSelectionRange(tl, br));
        top = other_top;
    }
    if (other_bottom < bottom) {
        QModelIndex tl = model->index(other_bottom + 1, left, parent);
        QModelIndex br = model->index(bottom, right, parent);
        result->append(QItemSelectionRange(tl, br));
        bottom = other_bottom;
    }
    if (other_left > left) {
        QModelIndex tl = model->index(top, left, parent);
        QModelIndex br = model->index(bottom, other_left - 1, parent);
        result->append(QItemSelectionRange(tl, br));
        left = other_left;
    }
    if (other_right < right) {
        QModelIndex tl = model->index(top, other_right + 1, parent);
        QModelIndex br = model->index(bottom, right, parent);
        result->append(QItemSelectionRange(tl, br));
        right = other_right;
    }
}